

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamAttributes::append(QXmlStreamAttributes *this,QString *qualifiedName,QString *value)

{
  long lVar1;
  long in_FS_OFFSET;
  rvalue_ref in_stack_ffffffffffffff48;
  QXmlStreamAttribute *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff98;
  QString *in_stack_ffffffffffffffa0;
  QXmlStreamAttribute *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamAttribute::QXmlStreamAttribute
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QList<QXmlStreamAttribute>::append
            ((QList<QXmlStreamAttribute> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  QXmlStreamAttribute::~QXmlStreamAttribute(in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamAttributes::append(const QString &qualifiedName, const QString &value)
{
    append(QXmlStreamAttribute(qualifiedName, value));
}